

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::setAxis
          (btGeneric6DofSpring2Constraint *this,btVector3 *axis1,btVector3 *axis2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_38;
  float local_34;
  float local_30;
  undefined8 local_28;
  float local_20;
  
  fVar7 = (float)*(undefined8 *)axis1->m_floats;
  fVar11 = (float)((ulong)*(undefined8 *)axis1->m_floats >> 0x20);
  fVar3 = axis1->m_floats[2];
  fVar6 = 1.0 / SQRT(fVar3 * fVar3 + fVar7 * fVar7 + fVar11 * fVar11);
  fVar7 = fVar7 * fVar6;
  fVar11 = fVar11 * fVar6;
  fVar6 = fVar6 * fVar3;
  fVar9 = (float)*(undefined8 *)axis2->m_floats;
  fVar10 = (float)((ulong)*(undefined8 *)axis2->m_floats >> 0x20);
  fVar3 = axis2->m_floats[2];
  fVar8 = 1.0 / SQRT(fVar3 * fVar3 + fVar9 * fVar9 + fVar10 * fVar10);
  fVar9 = fVar9 * fVar8;
  fVar10 = fVar10 * fVar8;
  fVar8 = fVar8 * fVar3;
  fVar3 = fVar10 * fVar6 - fVar11 * fVar8;
  fVar4 = fVar8 * fVar7 - fVar6 * fVar9;
  fVar5 = fVar9 * fVar11 - fVar7 * fVar10;
  btTransform::inverse
            (&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform);
  fVar12 = (float)((ulong)local_28 >> 0x20);
  *(ulong *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       CONCAT44(local_50 * fVar8 + local_58 * fVar9 + local_54 * fVar10,
                local_50 * fVar5 + local_58 * fVar3 + local_54 * fVar4);
  (this->m_frameInA).m_basis.m_el[0].m_floats[2] =
       fVar6 * local_50 + fVar7 * local_58 + fVar11 * local_54;
  (this->m_frameInA).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       CONCAT44(local_40 * fVar8 + local_48 * fVar9 + local_44 * fVar10,
                local_40 * fVar5 + local_48 * fVar3 + local_44 * fVar4);
  (this->m_frameInA).m_basis.m_el[1].m_floats[2] =
       fVar6 * local_40 + fVar7 * local_48 + fVar11 * local_44;
  (this->m_frameInA).m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       CONCAT44(local_30 * fVar8 + local_38 * fVar9 + local_34 * fVar10,
                local_30 * fVar5 + local_38 * fVar3 + local_34 * fVar4);
  (this->m_frameInA).m_basis.m_el[2].m_floats[2] =
       fVar6 * local_30 + fVar7 * local_38 + fVar11 * local_34;
  (this->m_frameInA).m_basis.m_el[2].m_floats[3] = 0.0;
  auVar2._4_4_ = fVar12 + local_40 * 0.0 + local_48 * 0.0 + local_44 * 0.0;
  auVar2._0_4_ = (float)local_28 + local_50 * 0.0 + local_58 * 0.0 + local_54 * 0.0;
  auVar2._8_4_ = local_30 * 0.0 + local_38 * 0.0 + local_34 * 0.0 + local_20;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_frameInA).m_origin.m_floats = auVar2;
  btTransform::inverse
            (&(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform);
  *(ulong *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       CONCAT44(local_50 * fVar8 + local_58 * fVar9 + local_54 * fVar10,
                local_50 * fVar5 + local_58 * fVar3 + local_54 * fVar4);
  (this->m_frameInB).m_basis.m_el[0].m_floats[2] =
       fVar6 * local_50 + fVar7 * local_58 + fVar11 * local_54;
  (this->m_frameInB).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       CONCAT44(local_40 * fVar8 + local_48 * fVar9 + local_44 * fVar10,
                local_40 * fVar5 + local_48 * fVar3 + local_44 * fVar4);
  (this->m_frameInB).m_basis.m_el[1].m_floats[2] =
       fVar6 * local_40 + fVar7 * local_48 + fVar11 * local_44;
  (this->m_frameInB).m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       CONCAT44(local_30 * fVar8 + local_38 * fVar9 + local_34 * fVar10,
                local_30 * fVar5 + local_38 * fVar3 + local_34 * fVar4);
  (this->m_frameInB).m_basis.m_el[2].m_floats[2] =
       fVar6 * local_30 + fVar7 * local_38 + fVar11 * local_34;
  (this->m_frameInB).m_basis.m_el[2].m_floats[3] = 0.0;
  auVar1._4_4_ = fVar12 + local_40 * 0.0 + local_48 * 0.0 + local_44 * 0.0;
  auVar1._0_4_ = (float)local_28 + local_50 * 0.0 + local_58 * 0.0 + local_54 * 0.0;
  auVar1._8_4_ = local_30 * 0.0 + local_38 * 0.0 + local_34 * 0.0 + local_20;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_frameInB).m_origin.m_floats = auVar1;
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setAxis(const btVector3& axis1,const btVector3& axis2)
{
	btVector3 zAxis = axis1.normalized();
	btVector3 yAxis = axis2.normalized();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system
	
	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue( xAxis[0], yAxis[0], zAxis[0],
	                              xAxis[1], yAxis[1], zAxis[1],
	                              xAxis[2], yAxis[2], zAxis[2]);
	
	// now get constraint frame in local coordinate systems
	m_frameInA = m_rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = m_rbB.getCenterOfMassTransform().inverse() * frameInW;
	
	calculateTransforms();
}